

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatumFactory.cpp
# Opt level: O2

VRDatumPtr __thiscall
MinVR::VRDatumFactory::CreateVRDatum(VRDatumFactory *this,int VRDatumId,void *pData)

{
  iterator iVar1;
  VRError *this_00;
  VRDatumPtrRC *extraout_RDX;
  undefined4 in_register_00000034;
  VRDatumPtr VVar2;
  allocator<char> local_ac;
  allocator<char> local_ab;
  allocator<char> local_aa;
  allocator<char> local_a9;
  int local_a8;
  key_type local_a4;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_a4 = (key_type)pData;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>,_std::_Select1st<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>,_std::_Select1st<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>_>
                  *)CONCAT44(in_register_00000034,VRDatumId),&local_a4);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(((_Rb_tree<int,_std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>,_std::_Select1st<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>_>
          *)CONCAT44(in_register_00000034,VRDatumId))->_M_impl).super__Rb_tree_header) {
    (*(code *)iVar1._M_node[1]._M_parent)(this);
    VVar2.reference = extraout_RDX;
    VVar2.pData = (VRDatum_conflict *)this;
    return VVar2;
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Unknown VR type ID.",&local_a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_aa);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDatumFactory.cpp"
             ,&local_ab);
  local_a8 = 0xb;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"VRDatumPtr MinVR::VRDatumFactory::CreateVRDatum(int, void *)",
             &local_ac);
  VRError::VRError(this_00,&local_40,&local_60,&local_80,&local_a8,&local_a0);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRDatumPtr VRDatumFactory::CreateVRDatum(int VRDatumId,
                                         void* pData) {
  // try to find the callback corresponding to the given type id;
  // if no id found, throw exception
  CallbackMap::const_iterator it = m_callbacks.find(VRDatumId);
  if (it == m_callbacks.end()) {
    VRERRORNOADV("Unknown VR type ID.");
  } else {
    // create the instance using the creator callback
    return VRDatumPtr((it->second)(static_cast<void *>(pData)));
  }
}